

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O1

Fl_Double_Window * make_settings_window(void)

{
  uint *puVar1;
  int iVar2;
  Fl_Double_Window *this;
  Fl_Input *pFVar3;
  undefined8 in_RAX;
  Fl_Window *this_00;
  Fl_Menu_ *this_01;
  Fl_Group *pFVar4;
  Fl_Box *this_02;
  Fl_Check_Button *pFVar5;
  Fl_Spinner *pFVar6;
  Fl_Widget *this_03;
  Fl_Group *pFVar7;
  Fl_Button *this_04;
  int s;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  this_00 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this_00,0x168,0x163,"GUI Settings");
  settings_window = (Fl_Double_Window *)this_00;
  this_01 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)this_01,0x8c,10,0x73,0x19,"Scheme: ");
  scheme_choice = (Fl_Choice *)this_01;
  this_01->down_box_ = '\x0e';
  (this_01->super_Fl_Widget).label_.font = 1;
  (this_01->super_Fl_Widget).callback_ = scheme_cb;
  Fl_Menu_::menu(this_01,menu_scheme_choice);
  Fl_Preferences::get(&fluid_prefs,"scheme",&local_24,0);
  Fl_Choice::value(scheme_choice,local_24);
  scheme_cb((Fl_Choice *)0x0,(void *)0x0);
  pFVar4 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar4,0x14,0x2b,0x14a,0xa1,(char *)0x0);
  (pFVar4->super_Fl_Widget).label_.font = 1;
  (pFVar4->super_Fl_Widget).label_.align_ = 0;
  this_02 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(this_02,0x8c,0x2b,1,0x19,"Options: ");
  (this_02->super_Fl_Widget).label_.font = 1;
  (this_02->super_Fl_Widget).label_.align_ = 4;
  pFVar5 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar5,0x8a,0x2b,0x71,0x19,"Show Tooltips");
  tooltips_button = pFVar5;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.label_.size = 0xc;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ = cb_tooltips_button;
  Fl_Preferences::get(&fluid_prefs,"show_tooltips",&local_24,1);
  Fl_Button::value((Fl_Button *)tooltips_button,local_24);
  Fl::option(OPTION_SHOW_TOOLTIPS,local_24 != 0);
  pFVar5 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar5,0x8a,0x44,0xba,0x19,"Show Completion Dialogs");
  completion_button = pFVar5;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.label_.size = 0xc;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ = cb_completion_button;
  Fl_Preferences::get(&fluid_prefs,"show_completion_dialogs",&local_24,1);
  Fl_Button::value((Fl_Button *)completion_button,local_24);
  pFVar5 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar5,0x8a,0x5d,0xd6,0x19,"Open Previous File on Startup");
  openlast_button = pFVar5;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.label_.size = 0xc;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ = cb_openlast_button;
  Fl_Preferences::get(&fluid_prefs,"open_previous_file",&local_24,0);
  Fl_Button::value((Fl_Button *)openlast_button,local_24);
  pFVar5 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar5,0x8a,0x76,0xd1,0x19,"Remember Window Positions");
  prevpos_button = pFVar5;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.label_.size = 0xc;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ = cb_prevpos_button;
  Fl_Preferences::get(&fluid_prefs,"prev_window_pos",&local_24,1);
  Fl_Button::value((Fl_Button *)prevpos_button,local_24);
  pFVar5 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar5,0x8a,0x8f,0xd1,0x19,"Show Comments in Browser");
  show_comments_button = pFVar5;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.label_.size = 0xc;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       cb_show_comments_button;
  Fl_Preferences::get(&fluid_prefs,"show_comments",&show_comments,1);
  Fl_Button::value((Fl_Button *)show_comments_button,show_comments);
  Fl_Group::end(pFVar4);
  pFVar6 = (Fl_Spinner *)operator_new(0x290);
  Fl_Spinner::Fl_Spinner(pFVar6,0x8c,0xad,0x28,0x19,"# Recent Files: ");
  recent_spinner = pFVar6;
  (pFVar6->super_Fl_Group).super_Fl_Widget.label_.font = 1;
  (pFVar6->super_Fl_Group).super_Fl_Widget.callback_ = cb_recent_spinner;
  (pFVar6->super_Fl_Group).super_Fl_Widget.when_ = '\x01';
  Fl_Preferences::get(&fluid_prefs,"recent_files",&local_24,5);
  pFVar6 = recent_spinner;
  recent_spinner->maximum_ = 10.0;
  pFVar6->value_ = (double)local_24;
  Fl_Spinner::update(pFVar6);
  pFVar4 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar4,10,0xd2,0x151,0x5f,(char *)0x0);
  (pFVar4->super_Fl_Widget).box_ = '\x06';
  (pFVar4->super_Fl_Widget).color_ = 0x2f;
  pFVar5 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar5,0x19,0xda,0xd1,0x16,"Use external editor?");
  use_external_editor_button = pFVar5;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.label_.size = 0xc;
  (pFVar5->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       cb_use_external_editor_button;
  Fl_Preferences::get(&fluid_prefs,"use_external_editor",&G_use_external_editor,0);
  Fl_Button::value((Fl_Button *)use_external_editor_button,G_use_external_editor);
  this_03 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)this_03,0x19,0x108,0x131,0x15,"Editor Command");
  editor_command_input = (Fl_Input *)this_03;
  Fl_Widget::tooltip(this_03,
                     "The editor command to open your external text editor.\nInclude any necessary flags to ensure your editor does not background itself.\nExamples:\n    gvim -f\n    gedit\n emacs"
                    );
  pFVar3 = editor_command_input;
  (editor_command_input->super_Fl_Input_).super_Fl_Widget.label_.size = 0xc;
  (pFVar3->super_Fl_Input_).textsize_ = 0xc;
  (pFVar3->super_Fl_Input_).super_Fl_Widget.callback_ = cb_editor_command_input;
  (pFVar3->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar3->super_Fl_Input_).super_Fl_Widget.when_ = '\x01';
  Fl_Preferences::get(&fluid_prefs,"external_editor_command",G_external_editor_command,"",0x1ff);
  Fl_Input_::value(&editor_command_input->super_Fl_Input_,G_external_editor_command);
  Fl_Group::end(pFVar4);
  pFVar7 = Fl_Group::current();
  pFVar7->resizable_ = (Fl_Widget *)pFVar4;
  this_04 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_04,0x11d,0x140,0x40,0x19,"Close");
  Fl_Widget::tooltip((Fl_Widget *)this_04,"Close this dialog.");
  (this_04->super_Fl_Widget).callback_ = cb_Close1;
  iVar2 = (this_00->super_Fl_Group).super_Fl_Widget.h_;
  this_00->minw = (this_00->super_Fl_Group).super_Fl_Widget.w_;
  this_00->minh = iVar2;
  this_00->maxw = 0;
  this_00->maxh = 0;
  this_00->dw = 0;
  this_00->dh = 0;
  this_00->aspect = 0;
  Fl_Window::size_range_(this_00);
  this = settings_window;
  puVar1 = &(settings_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x20;
  Fl_Group::end((Fl_Group *)this);
  return settings_window;
}

Assistant:

Fl_Double_Window* make_settings_window() {
  { Fl_Double_Window* o = settings_window = new Fl_Double_Window(360, 355, "GUI Settings");
    { scheme_choice = new Fl_Choice(140, 10, 115, 25, "Scheme: ");
      scheme_choice->down_box(FL_BORDER_BOX);
      scheme_choice->labelfont(1);
      scheme_choice->callback((Fl_Callback*)scheme_cb);
      scheme_choice->menu(menu_scheme_choice);
      int s;
      fluid_prefs.get("scheme", s, 0);
      scheme_choice->value(s);
      scheme_cb(0, 0);
    } // Fl_Choice* scheme_choice
    { Fl_Group* o = new Fl_Group(20, 43, 330, 161);
      o->labelfont(1);
      o->align(Fl_Align(FL_ALIGN_CENTER));
      { Fl_Box* o = new Fl_Box(140, 43, 1, 25, "Options: ");
        o->labelfont(1);
        o->align(Fl_Align(FL_ALIGN_LEFT));
      } // Fl_Box* o
      { tooltips_button = new Fl_Check_Button(138, 43, 113, 25, "Show Tooltips");
        tooltips_button->down_box(FL_DOWN_BOX);
        tooltips_button->labelsize(12);
        tooltips_button->callback((Fl_Callback*)cb_tooltips_button);
        int b;
        fluid_prefs.get("show_tooltips", b, 1);
        tooltips_button->value(b);
        Fl_Tooltip::enable(b);
      } // Fl_Check_Button* tooltips_button
      { completion_button = new Fl_Check_Button(138, 68, 186, 25, "Show Completion Dialogs");
        completion_button->down_box(FL_DOWN_BOX);
        completion_button->labelsize(12);
        completion_button->callback((Fl_Callback*)cb_completion_button);
        int b;
        fluid_prefs.get("show_completion_dialogs", b, 1);
        completion_button->value(b);
      } // Fl_Check_Button* completion_button
      { openlast_button = new Fl_Check_Button(138, 93, 214, 25, "Open Previous File on Startup");
        openlast_button->down_box(FL_DOWN_BOX);
        openlast_button->labelsize(12);
        openlast_button->callback((Fl_Callback*)cb_openlast_button);
        int b;
        fluid_prefs.get("open_previous_file", b, 0);
        openlast_button->value(b);
      } // Fl_Check_Button* openlast_button
      { prevpos_button = new Fl_Check_Button(138, 118, 209, 25, "Remember Window Positions");
        prevpos_button->down_box(FL_DOWN_BOX);
        prevpos_button->labelsize(12);
        prevpos_button->callback((Fl_Callback*)cb_prevpos_button);
        int b;
        fluid_prefs.get("prev_window_pos", b, 1);
        prevpos_button->value(b);
      } // Fl_Check_Button* prevpos_button
      { show_comments_button = new Fl_Check_Button(138, 143, 209, 25, "Show Comments in Browser");
        show_comments_button->down_box(FL_DOWN_BOX);
        show_comments_button->labelsize(12);
        show_comments_button->callback((Fl_Callback*)cb_show_comments_button);
        fluid_prefs.get("show_comments", show_comments, 1);
        show_comments_button->value(show_comments);
      } // Fl_Check_Button* show_comments_button
      o->end();
    } // Fl_Group* o
    { recent_spinner = new Fl_Spinner(140, 173, 40, 25, "# Recent Files: ");
      recent_spinner->labelfont(1);
      recent_spinner->callback((Fl_Callback*)cb_recent_spinner);
      recent_spinner->when(FL_WHEN_CHANGED);
      int c;
      fluid_prefs.get("recent_files", c, 5);
      recent_spinner->maximum(10);
      recent_spinner->value(c);
    } // Fl_Spinner* recent_spinner
    { Fl_Group* o = new Fl_Group(10, 210, 337, 95);
      o->box(FL_THIN_UP_BOX);
      o->color(FL_DARK1);
      { use_external_editor_button = new Fl_Check_Button(25, 218, 209, 22, "Use external editor?");
        use_external_editor_button->down_box(FL_DOWN_BOX);
        use_external_editor_button->labelsize(12);
        use_external_editor_button->callback((Fl_Callback*)cb_use_external_editor_button);
        fluid_prefs.get("use_external_editor", G_use_external_editor, 0);
        use_external_editor_button->value(G_use_external_editor);
      } // Fl_Check_Button* use_external_editor_button
      { editor_command_input = new Fl_Input(25, 264, 305, 21, "Editor Command");
        editor_command_input->tooltip("The editor command to open your external text editor.\nInclude any necessary \
flags to ensure your editor does not background itself.\nExamples:\n    gvim -\
f\n    gedit\n emacs");
        editor_command_input->labelsize(12);
        editor_command_input->textsize(12);
        editor_command_input->callback((Fl_Callback*)cb_editor_command_input);
        editor_command_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
        editor_command_input->when(FL_WHEN_CHANGED);
        fluid_prefs.get("external_editor_command", G_external_editor_command, "", sizeof(G_external_editor_command)-1);
        editor_command_input->value(G_external_editor_command);
      } // Fl_Input* editor_command_input
      o->end();
      Fl_Group::current()->resizable(o);
    } // Fl_Group* o
    { Fl_Button* o = new Fl_Button(285, 320, 64, 25, "Close");
      o->tooltip("Close this dialog.");
      o->callback((Fl_Callback*)cb_Close1);
    } // Fl_Button* o
    o->size_range(o->w(), o->h());
    settings_window->set_non_modal();
    settings_window->end();
  } // Fl_Double_Window* settings_window
  return settings_window;
}